

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O2

char32_t QChar::toUpper(char32_t ucs4)

{
  char32_t cVar1;
  
  if (0x10ffff < (uint)ucs4) {
    return ucs4;
  }
  cVar1 = convertCase_helper<char32_t>(ucs4,UpperCase);
  return cVar1;
}

Assistant:

char32_t QChar::toUpper(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return ucs4;
    return convertCase_helper(ucs4, QUnicodeTables::UpperCase);
}